

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  FILE *__stream;
  pointer *__ptr;
  char *pcVar1;
  char *in_R9;
  bool bVar2;
  AssertHelper local_168;
  AssertionResult gtest_ar_3;
  size_t num_bytes;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  char contents [24];
  AssertHelper local_108;
  string kExpectedDense;
  string kExpectedSparse;
  TypeParam ht_out;
  
  kExpectedSparse._M_dataplus._M_p = (pointer)0x0;
  kExpectedSparse._M_string_length._0_4_ = 0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((ulong)gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  kExpectedDense._M_dataplus._M_p = kExpectedDense._M_dataplus._M_p & 0xffffffff00000000;
  kExpectedDense._M_string_length = 0;
  google::
  HashtableInterface_SparseHashSet<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (&ht_out,0,(hasher *)&kExpectedSparse,(key_equal *)&gtest_ar,
             (allocator_type *)&kExpectedDense);
  kExpectedDense._M_dataplus._M_p = (pointer)&kExpectedDense.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&kExpectedDense,anon_var_dwarf_168508,anon_var_dwarf_168508 + 0x18);
  kExpectedSparse._M_dataplus._M_p = (pointer)&kExpectedSparse.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&kExpectedSparse,"$hu1","");
  __stream = tmpfile();
  contents[8] = '\0';
  contents[9] = '\0';
  contents[10] = '\0';
  contents[0xb] = '\0';
  contents[0xc] = '\0';
  contents[0xd] = '\0';
  contents[0xe] = '\0';
  contents[0xf] = '\0';
  bVar2 = __stream != (FILE *)0x0;
  contents[0] = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)contents,(AssertionResult *)"fp != __null","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x542,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_bytes,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_bytes);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(contents + 8));
  this_00 = &ht_out.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  contents[0] = google::
                sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::write_metadata<_IO_FILE>(&this_00->rep,(_IO_FILE *)__stream);
  contents[8] = '\0';
  contents[9] = '\0';
  contents[10] = '\0';
  contents[0xb] = '\0';
  contents[0xc] = '\0';
  contents[0xd] = '\0';
  contents[0xe] = '\0';
  contents[0xf] = '\0';
  if (!(bool)contents[0]) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)contents,
               (AssertionResult *)"ht_out.write_metadata(fp)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x544,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_bytes,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_bytes);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(contents + 8));
  contents[0] = google::
                sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::write_nopointer_data
                          (&ht_out.
                            super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            .ht_.rep.table,(FILE *)__stream);
  contents[8] = '\0';
  contents[9] = '\0';
  contents[10] = '\0';
  contents[0xb] = '\0';
  contents[0xc] = '\0';
  contents[0xd] = '\0';
  contents[0xe] = '\0';
  contents[0xf] = '\0';
  if (!(bool)contents[0]) {
    testing::Message::Message((Message *)&gtest_ar_3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)contents,
               (AssertionResult *)"ht_out.write_nopointer_data(fp)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_bytes,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x545,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_bytes,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_bytes);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(contents + 8));
  num_bytes = ftell(__stream);
  rewind(__stream);
  contents[0] = '\x18';
  contents[1] = '\0';
  contents[2] = '\0';
  contents[3] = '\0';
  contents[4] = '\0';
  contents[5] = '\0';
  contents[6] = '\0';
  contents[7] = '\0';
  testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"num_bytes","static_cast<size_t>(24)",&num_bytes,
             (unsigned_long *)contents);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)contents);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x549,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)contents);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (contents._0_8_ != 0) {
      (**(code **)(*(long *)contents._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_3._0_8_ = fread(contents,1,num_bytes,__stream);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"num_bytes","fread(contents, 1, num_bytes, fp)",&num_bytes,
             (unsigned_long *)&gtest_ar_3);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x54b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_3._0_4_ = 0xffffffff;
  local_168.data_._0_4_ = fgetc(__stream);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(-1)","fgetc(fp)",(int *)&gtest_ar_3,(int *)&local_168);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_3);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x54c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (gtest_ar_3._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  fclose(__stream);
  gtest_ar._0_8_ = &local_138;
  if (contents[0] == *kExpectedDense._M_dataplus._M_p) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&gtest_ar,contents,contents + num_bytes);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_3,"kExpectedDense","string(contents, num_bytes)",
               &kExpectedDense,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x550,pcVar1);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar);
LAB_00955dc6:
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&gtest_ar,contents,contents + num_bytes);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_3,"kExpectedSparse","string(contents, num_bytes)",
               &kExpectedSparse,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_3.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x552,pcVar1);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar);
      goto LAB_00955dc6;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_138._M_local_buf[0] = '\0';
  num_bytes = (size_t)&gtest_ar;
  gtest_ar._0_8_ = &local_138;
  bVar2 = google::
          sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                    ((sparse_hashtable<int,int,Hasher,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00);
  gtest_ar_3.success_ = bVar2;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)contents,(internal *)&gtest_ar_3,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55b,(char *)contents._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)contents);
    if ((long *)CONCAT44(local_168.data_._4_4_,(int)local_168.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_168.data_._4_4_,(int)local_168.data_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  if (*(char *)gtest_ar._0_8_ == *kExpectedDense._M_dataplus._M_p) {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)contents,"kExpectedDense","stringbuf",&kExpectedDense,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    if (contents[0] != '\0') goto LAB_00955faa;
    testing::Message::Message((Message *)&gtest_ar_3);
    if (contents._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)contents._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar_3);
  }
  else {
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)contents,"kExpectedSparse","stringbuf",&kExpectedSparse,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    if (contents[0] != '\0') goto LAB_00955faa;
    testing::Message::Message((Message *)&gtest_ar_3);
    if (contents._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)contents._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x55f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)&gtest_ar_3);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_168);
  if (gtest_ar_3._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
  }
LAB_00955faa:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(contents + 8));
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&kExpectedSparse);
  std::__cxx11::string::~string((string *)&kExpectedDense);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::~BaseHashtableInterface
            (&ht_out.
              super_BaseHashtableInterface<google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            );
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}